

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

Scl_Tree_t * Scl_LibertyParse(char *pFileName,int fVerbose)

{
  long lVar1;
  int iVar2;
  Scl_Tree_t *p;
  char *__format;
  long lVar3;
  char *pPos;
  timespec local_30;
  char *local_20;
  
  p = Scl_LibertyStart(pFileName);
  if (p == (Scl_Tree_t *)0x0) {
    p = (Scl_Tree_t *)0x0;
  }
  else {
    local_20 = p->pContents;
    Scl_LibertyWipeOutComments(local_20,local_20 + p->nContents);
    iVar2 = Scl_LibertyBuildItem(p,&local_20,p->pContents + p->nContents);
    if (iVar2 == 0) {
      if (fVerbose == 0) {
        return p;
      }
      __format = "Parsing finished successfully.  ";
    }
    else {
      if (p->pError != (char *)0x0) {
        printf("%s");
      }
      __format = "Parsing failed.  ";
    }
    printf(__format);
    iVar2 = clock_gettime(3,&local_30);
    if (iVar2 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    lVar1 = p->clkStart;
    Abc_Print(1,"%s =","Parsing time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar3 - lVar1) / 1000000.0);
  }
  return p;
}

Assistant:

Scl_Tree_t * Scl_LibertyParse( char * pFileName, int fVerbose )
{
    Scl_Tree_t * p;
    char * pPos;
    if ( (p = Scl_LibertyStart(pFileName)) == NULL )
        return NULL;
    pPos = p->pContents;
    Scl_LibertyWipeOutComments( p->pContents, p->pContents+p->nContents );
    if ( !Scl_LibertyBuildItem( p, &pPos, p->pContents + p->nContents ) == 0 )
    {
        if ( p->pError ) printf( "%s", p->pError );
        printf( "Parsing failed.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    else if ( fVerbose )
    {
        printf( "Parsing finished successfully.  " );
        Abc_PrintTime( 1, "Parsing time", Abc_Clock() - p->clkStart );
    }
    return p;
}